

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O2

void write_tables_only(j_compress_ptr cinfo)

{
  long lVar1;
  
  emit_marker(cinfo,M_SOI);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    if (cinfo->quant_tbl_ptrs[lVar1] != (JQUANT_TBL *)0x0) {
      emit_dqt(cinfo,(int)lVar1);
    }
  }
  if (cinfo->arith_code == 0) {
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      if (cinfo->dc_huff_tbl_ptrs[lVar1] != (JHUFF_TBL *)0x0) {
        emit_dht(cinfo,(int)lVar1,0);
      }
      if (cinfo->ac_huff_tbl_ptrs[lVar1] != (JHUFF_TBL *)0x0) {
        emit_dht(cinfo,(int)lVar1,1);
      }
    }
  }
  emit_marker(cinfo,M_EOI);
  return;
}

Assistant:

METHODDEF(void)
write_tables_only(j_compress_ptr cinfo)
{
  int i;

  emit_marker(cinfo, M_SOI);

  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    if (cinfo->quant_tbl_ptrs[i] != NULL)
      (void)emit_dqt(cinfo, i);
  }

  if (!cinfo->arith_code) {
    for (i = 0; i < NUM_HUFF_TBLS; i++) {
      if (cinfo->dc_huff_tbl_ptrs[i] != NULL)
        emit_dht(cinfo, i, FALSE);
      if (cinfo->ac_huff_tbl_ptrs[i] != NULL)
        emit_dht(cinfo, i, TRUE);
    }
  }

  emit_marker(cinfo, M_EOI);
}